

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O3

btree_result btree_get_key_range(btree *btree,idx_t num,idx_t den,void *key_begin,void *key_end)

{
  ushort uVar1;
  btree_print_func *pbVar2;
  void *pvVar3;
  _func_voidref_void_ptr_bid_t *p_Var4;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var5;
  _func_bid_t_void_ptr *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  idx_t iVar9;
  bnode *pbVar10;
  bid_t bVar11;
  bnode *pbVar12;
  bnode *pbVar13;
  undefined1 *puVar14;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  undefined1 *puVar15;
  idx_t iVar16;
  ulong uVar17;
  int iVar18;
  bnode *node_1;
  btree_result bVar19;
  bnode *node;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  undefined1 *local_38;
  
  uVar17 = CONCAT62(in_register_00000012,den) & 0xffffffff;
  puVar14 = auStack_68 + -(ulong)(btree->ksize + 0xf & 0xfffffff0);
  puVar15 = puVar14 + -(ulong)(btree->vsize + 0xf & 0xfffffff0);
  bVar19 = BTREE_RESULT_FAIL;
  if (num < (ushort)uVar17) {
    pbVar2 = btree->kv_ops->init_kv_var;
    local_48 = key_begin;
    local_40 = key_end;
    local_38 = puVar14;
    if (pbVar2 != (btree_print_func *)0x0) {
      *(undefined8 *)(puVar15 + -8) = 0x11b212;
      (*pbVar2)(btree,puVar14,puVar15);
    }
    bVar11 = btree->root_bid;
    pvVar3 = btree->blk_handle;
    p_Var4 = btree->blk_ops->blk_read;
    *(undefined8 *)(puVar15 + -8) = 0x11b221;
    pbVar10 = (bnode *)(*p_Var4)(pvVar3,bVar11);
    puVar14 = local_38;
    pvVar3 = local_48;
    pbVar12 = pbVar10 + 1;
    if ((pbVar10->flag & 2) != 0) {
      pbVar12 = (bnode *)((long)&pbVar12->kvsize +
                         (ulong)((ushort)(pbVar12->kvsize << 8 | pbVar12->kvsize >> 8) + 0x11 &
                                0xfffffff0));
    }
    (pbVar10->field_4).data = pbVar12;
    uVar1 = pbVar10->nentry;
    if (btree->height == 1) {
      iVar18 = (int)CONCAT62(in_register_00000032,num);
      p_Var5 = btree->kv_ops->get_kv;
      *(undefined8 *)(puVar15 + -8) = 0x11b276;
      (*p_Var5)(pbVar10,(idx_t)(((uint)uVar1 * iVar18) / uVar17),pvVar3,(void *)0x0);
      pvVar3 = local_40;
      uVar1 = pbVar10->nentry;
      p_Var5 = btree->kv_ops->get_kv;
      *(undefined8 *)(puVar15 + -8) = 0x11b2a1;
      (*p_Var5)(pbVar10,(short)((ulong)((uint)uVar1 * (iVar18 + 1)) /
                               (CONCAT62(in_register_00000012,den) & 0xffffffff)) - 1,pvVar3,
                (void *)0x0);
    }
    else {
      local_50 = ((ulong)uVar1 * 0x10 * (ulong)num * 0x10) / ((ulong)den << 4);
      local_60 = (((ulong)num * 0x10 + 0x10) * (ulong)uVar1 * 0x10) / ((ulong)den << 4) - 1;
      local_58 = local_50 >> 4;
      iVar16 = uVar1 - 1;
      if (((uint)(local_60 >> 4) & 0xffff) < (uint)uVar1) {
        iVar16 = (idx_t)(local_60 >> 4);
      }
      iVar9 = (idx_t)local_58;
      p_Var5 = btree->kv_ops->get_kv;
      *(undefined8 *)(puVar15 + -8) = 0x11b31a;
      (*p_Var5)(pbVar10,iVar9,puVar14,puVar15);
      p_Var6 = btree->kv_ops->value2bid;
      *(undefined8 *)(puVar15 + -8) = 0x11b324;
      bVar11 = (*p_Var6)(puVar15);
      pvVar3 = btree->blk_handle;
      p_Var4 = btree->blk_ops->blk_read;
      *(undefined8 *)(puVar15 + -8) = 0x11b335;
      pbVar12 = (bnode *)(*p_Var4)(pvVar3,bVar11 >> 0x38 | (bVar11 & 0xff000000000000) >> 0x28 |
                                          (bVar11 & 0xff0000000000) >> 0x18 |
                                          (bVar11 & 0xff00000000) >> 8 | (bVar11 & 0xff000000) << 8
                                          | (bVar11 & 0xff0000) << 0x18 | (bVar11 & 0xff00) << 0x28
                                          | bVar11 << 0x38);
      pvVar3 = local_48;
      pbVar13 = pbVar12 + 1;
      if ((pbVar12->flag & 2) != 0) {
        pbVar13 = (bnode *)((long)&pbVar13->kvsize +
                           (ulong)((ushort)(pbVar13->kvsize << 8 | pbVar13->kvsize >> 8) + 0x11 &
                                  0xfffffff0));
      }
      (pbVar12->field_4).data = pbVar13;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = ((ulong)pbVar12->nentry - 1) * (ulong)((uint)local_50 & 0xf);
      p_Var5 = btree->kv_ops->get_kv;
      *(undefined8 *)(puVar15 + -8) = 0x11b38f;
      (*p_Var5)(pbVar12,(idx_t)(SUB164(auVar7 * ZEXT816(0x8888888888888889),8) >> 3),pvVar3,
                (void *)0x0);
      puVar14 = local_38;
      if (iVar16 != (idx_t)local_58) {
        p_Var5 = btree->kv_ops->get_kv;
        *(undefined8 *)(puVar15 + -8) = 0x11b3aa;
        (*p_Var5)(pbVar10,iVar16,puVar14,puVar15);
        p_Var6 = btree->kv_ops->value2bid;
        *(undefined8 *)(puVar15 + -8) = 0x11b3b4;
        bVar11 = (*p_Var6)(puVar15);
        pvVar3 = btree->blk_handle;
        p_Var4 = btree->blk_ops->blk_read;
        *(undefined8 *)(puVar15 + -8) = 0x11b3c5;
        pbVar12 = (bnode *)(*p_Var4)(pvVar3,bVar11 >> 0x38 | (bVar11 & 0xff000000000000) >> 0x28 |
                                            (bVar11 & 0xff0000000000) >> 0x18 |
                                            (bVar11 & 0xff00000000) >> 8 |
                                            (bVar11 & 0xff000000) << 8 | (bVar11 & 0xff0000) << 0x18
                                            | (bVar11 & 0xff00) << 0x28 | bVar11 << 0x38);
        pbVar10 = pbVar12 + 1;
        if ((pbVar12->flag & 2) != 0) {
          pbVar10 = (bnode *)((long)&pbVar10->kvsize +
                             (ulong)((ushort)(pbVar10->kvsize << 8 | pbVar10->kvsize >> 8) + 0x11 &
                                    0xfffffff0));
        }
        (pbVar12->field_4).data = pbVar10;
      }
      pvVar3 = local_40;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = ((ulong)pbVar12->nentry - 1) * (ulong)((uint)local_60 & 0xf);
      p_Var5 = btree->kv_ops->get_kv;
      *(undefined8 *)(puVar15 + -8) = 0x11b41f;
      (*p_Var5)(pbVar12,(idx_t)(SUB164(auVar8 * ZEXT816(0x8888888888888889),8) >> 3),pvVar3,
                (void *)0x0);
    }
    puVar14 = local_38;
    pbVar2 = btree->kv_ops->free_kv_var;
    bVar19 = BTREE_RESULT_SUCCESS;
    if (pbVar2 != (btree_print_func *)0x0) {
      *(undefined8 *)(puVar15 + -8) = 0x11b43b;
      (*pbVar2)(btree,puVar14,puVar15);
      bVar19 = BTREE_RESULT_SUCCESS;
    }
  }
  return bVar19;
}

Assistant:

btree_result btree_get_key_range(
    struct btree *btree, idx_t num, idx_t den, void *key_begin, void *key_end)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    idx_t idx_begin, idx_end, idx;
    bid_t bid;
    struct bnode *root, *node;
    uint64_t _num, _den, _nentry, resolution, mask, _idx_begin, _idx_end;

    if (num >= den) {
        // TODO: Need to log the corresponding error message
        return BTREE_RESULT_FAIL;
    }
    resolution = 1<<4; mask = resolution-1;

    if (btree->kv_ops->init_kv_var) btree->kv_ops->init_kv_var(btree, k, v);
    _num = (uint64_t)num * resolution;
    _den = (uint64_t)den * resolution;

    // get root node
    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    root = _fetch_bnode(btree, addr, btree->height);
    _nentry = (uint64_t)root->nentry * resolution;

    if (btree->height == 1) {
        btree->kv_ops->get_kv(root, ((num+0) * root->nentry / den)-0, key_begin, NULL);
        btree->kv_ops->get_kv(root, ((num+1) * root->nentry / den)-1, key_end, NULL);
    }else{
        _idx_begin = (_num * _nentry / _den);
        _idx_end = ((_num+resolution) * _nentry / _den)-1;

        idx_begin = _idx_begin / resolution;
        idx_end = (_idx_end / resolution);
        if (idx_end >= root->nentry) idx_end = root->nentry-1;

        // get first child node (for KEY_BEGIN)
        btree->kv_ops->get_kv(root, idx_begin, k, v);
        bid = btree->kv_ops->value2bid(v);
        bid = _endian_decode(bid);
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid);
        node = _fetch_bnode(btree, addr, btree->height-1);

        idx = ((_idx_begin & mask) * (node->nentry-1) / (resolution-1));
        btree->kv_ops->get_kv(node, idx, key_begin, NULL);

        // get second child node (for KEY_END)
        if (idx_end != idx_begin) {
            btree->kv_ops->get_kv(root, idx_end, k, v);
            bid = btree->kv_ops->value2bid(v);
            bid = _endian_decode(bid);
            addr = btree->blk_ops->blk_read(btree->blk_handle, bid);
            node = _fetch_bnode(btree, addr, btree->height-1);
        }

        idx = ((_idx_end & mask) * (node->nentry-1) / (resolution-1));
        btree->kv_ops->get_kv(node, idx, key_end, NULL);
    }

    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
    return BTREE_RESULT_SUCCESS;
}